

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O3

void luaD_hookcall(lua_State *L,CallInfo *ci)

{
  ushort uVar1;
  long lVar2;
  
  L->oldpc = 0;
  if ((L->hookmask & 1U) != 0) {
    uVar1 = ci->callstatus;
    lVar2 = *(long *)((((ci->func).p)->val).value_.f + 0x18);
    (ci->u).l.savedpc = (Instruction *)((ci->u).c.k + 4);
    luaD_hook(L,uVar1 >> 3 & 4,-1,1,(uint)*(byte *)(lVar2 + 10));
    (ci->u).l.savedpc = (Instruction *)((ci->u).c.k + -4);
  }
  return;
}

Assistant:

void luaD_hookcall (lua_State *L, CallInfo *ci) {
  L->oldpc = 0;  /* set 'oldpc' for new function */
  if (L->hookmask & LUA_MASKCALL) {  /* is call hook on? */
    int event = (ci->callstatus & CIST_TAIL) ? LUA_HOOKTAILCALL
                                             : LUA_HOOKCALL;
    Proto *p = ci_func(ci)->p;
    ci->u.l.savedpc++;  /* hooks assume 'pc' is already incremented */
    luaD_hook(L, event, -1, 1, p->numparams);
    ci->u.l.savedpc--;  /* correct 'pc' */
  }
}